

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_ARB1_DEFB(Context *ctx)

{
  size_t in_RDX;
  char dst [64];
  char acStack_58 [72];
  
  get_ARB1_destarg_varname(ctx,acStack_58,in_RDX);
  push_output(ctx,&ctx->globals);
  output_line(ctx,"PARAM %s = %d;",acStack_58,(ulong)(ctx->dwords[0] != 0));
  pop_output(ctx);
  return;
}

Assistant:

static void emit_ARB1_DEFB(Context *ctx)
{
    char dst[64]; get_ARB1_destarg_varname(ctx, dst, sizeof (dst));
    push_output(ctx, &ctx->globals);
    output_line(ctx, "PARAM %s = %d;", dst, ctx->dwords[0] ? 1 : 0);
    pop_output(ctx);
}